

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

shared_ptr<Handler> __thiscall
GameEngine::generateBotHandlersChain(GameEngine *this,shared_ptr<Player> *bot)

{
  Player *this_00;
  CellType *pCVar1;
  element_type *peVar2;
  Handler *this_01;
  int iVar3;
  undefined8 this_02;
  undefined8 uVar4;
  GameEngine *pGVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  TypeName TVar9;
  ParamType size;
  int32_t iVar10;
  size_t sVar11;
  undefined4 extraout_var;
  RandomGenerator *pRVar12;
  Config *this_03;
  pair<int,_int> pVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  _func_int **pp_Var15;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar16;
  Handler *__tmp;
  undefined8 *in_RDX;
  ulong uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar18;
  undefined8 uVar19;
  long lVar20;
  uint uVar21;
  size_t index;
  bool bVar22;
  shared_ptr<Handler> sVar23;
  shared_ptr<Handler> link;
  shared_ptr<Population> newPopulation;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> chain;
  undefined1 local_1b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _func_int **local_180;
  _func_int **local_178;
  _func_int **local_170;
  _func_int **local_168;
  undefined8 *local_160;
  long local_158;
  ulong local_150;
  shared_ptr<Handler> local_148;
  shared_ptr<Population> local_138;
  shared_ptr<Population> local_128;
  shared_ptr<Population> local_118;
  shared_ptr<Population> local_108;
  shared_ptr<Population> local_f8;
  shared_ptr<Population> local_e8;
  shared_ptr<Population> local_d8;
  shared_ptr<Population> local_c8;
  shared_ptr<Population> local_b8;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> local_a8;
  shared_ptr<Population> local_88;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  _func_int **local_48;
  GameEngine *local_40;
  ulong local_38;
  
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._16_8_ = bot;
  local_160 = in_RDX;
  local_40 = this;
  sVar11 = Player::getPopulationsNumber((Player *)*in_RDX);
  if (0 < (int)(uint)sVar11) {
    local_38 = (ulong)((uint)sVar11 & 0x7fffffff);
    local_158 = 0;
    local_48 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001396a8;
    local_50 = (_func_int **)&PTR_setXYPos_00139b38;
    local_58 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139728;
    local_60 = (_func_int **)&PTR_setXYPos_00139ba8;
    local_68 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139778;
    local_70 = (_func_int **)&PTR_setXYPos_00139be0;
    local_178 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001397c8;
    local_180 = (_func_int **)&PTR_setXYPos_00139b70;
    local_168 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139818;
    local_170 = (_func_int **)&PTR_setXYPos_00139c18;
    uVar17 = 0;
    do {
      local_150 = uVar17;
      Player::getPopulation((Player *)local_1b8,(int32_t)*local_160);
      this_02 = local_1b8._8_8_;
      uVar19 = local_1b8._0_8_;
      local_1b8._0_8_ = (Population *)0x0;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar6 = Population::GetXPos((Population *)uVar19);
      local_190._8_8_ = CONCAT44(extraout_var,iVar6);
      iVar6 = Population::GetYPos((Population *)uVar19);
      pRVar12 = RandomGenerator::getInstance();
      iVar7 = RandomGenerator::randInt(pRVar12,1,2);
      iVar8 = Population::GetAnimalAmount((Population *)uVar19);
      this_03 = Config::getInstance();
      TVar9 = Population::GetType((Population *)uVar19);
      size = Population::GetSize((Population *)uVar19);
      iVar10 = Config::getMaxAmount(this_03,TVar9,size);
      iVar3 = iVar8 * 10;
      if (iVar3 != iVar10 * 9 && SBORROW4(iVar3,iVar10 * 9) == iVar3 + iVar10 * -9 < 0) {
        iVar7 = 3;
      }
      if (iVar7 == 1) {
        pRVar12 = RandomGenerator::getInstance();
        iVar6 = RandomGenerator::randInt(pRVar12,0,3);
        switch(iVar6) {
        case 0:
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var14->_M_use_count = 1;
          p_Var14->_M_weak_count = 1;
          p_Var14->_vptr__Sp_counted_base = local_48;
          local_1b8._0_8_ = p_Var14 + 1;
          p_Var14[1]._M_use_count = 0;
          p_Var14[1]._M_weak_count = 0;
          p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[2]._M_use_count = 0;
          p_Var14[2]._M_weak_count = 0;
          p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_50;
          break;
        case 1:
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var14->_M_use_count = 1;
          p_Var14->_M_weak_count = 1;
          p_Var14->_vptr__Sp_counted_base = local_58;
          local_1b8._0_8_ = p_Var14 + 1;
          p_Var14[1]._M_use_count = 0;
          p_Var14[1]._M_weak_count = 0;
          p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[2]._M_use_count = 0;
          p_Var14[2]._M_weak_count = 0;
          p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_60;
          break;
        case 2:
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var14->_M_use_count = 1;
          p_Var14->_M_weak_count = 1;
          p_Var14->_vptr__Sp_counted_base = local_68;
          local_1b8._0_8_ = p_Var14 + 1;
          p_Var14[1]._M_use_count = 0;
          p_Var14[1]._M_weak_count = 0;
          p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[2]._M_use_count = 0;
          p_Var14[2]._M_weak_count = 0;
          p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_70;
          break;
        case 3:
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var14->_M_use_count = 1;
          p_Var14->_M_weak_count = 1;
          p_Var14->_vptr__Sp_counted_base = local_178;
          local_1b8._0_8_ = p_Var14 + 1;
          p_Var14[1]._M_use_count = 0;
          p_Var14[1]._M_weak_count = 0;
          p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[2]._M_use_count = 0;
          p_Var14[2]._M_weak_count = 0;
          p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_180;
          break;
        default:
          goto switchD_001280c1_default;
        }
        uVar4 = local_1b8._8_8_;
        p_Var14[1]._vptr__Sp_counted_base = pp_Var15;
        bVar22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8._8_8_ = p_Var14;
        if (bVar22) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
switchD_001280c1_default:
        local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar19;
        local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
          }
        }
        Handler::setPopulation((Handler *)local_1b8._0_8_,&local_b8);
        uVar19 = local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
LAB_00128754:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar19 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar19);
        }
      }
      else {
        if (iVar7 != 2) {
          if (iVar7 != 3) goto LAB_0012875e;
          local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar19;
          local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
            }
          }
          pVar13 = getDestinationPos((GameEngine *)local_1b8._16_8_,&local_f8);
          if (local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((ulong)pVar13 >> 0x20 == 0 && pVar13.first == 0) {
            p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
            uVar4 = local_1b8._8_8_;
            p_Var14->_M_use_count = 1;
            p_Var14->_M_weak_count = 1;
            p_Var14->_vptr__Sp_counted_base = local_178;
            local_1b8._0_8_ = p_Var14 + 1;
            p_Var14[1]._M_use_count = 0;
            p_Var14[1]._M_weak_count = 0;
            p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var14[2]._M_use_count = 0;
            p_Var14[2]._M_weak_count = 0;
            p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var14[1]._vptr__Sp_counted_base = local_180;
            bVar22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8._8_8_ = p_Var14;
            if (bVar22) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
            }
            local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar19;
            local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
              }
            }
            Handler::setPopulation((Handler *)local_1b8._0_8_,&local_108);
            uVar19 = local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          }
          else {
            local_1b8._32_8_ = (Population *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Population,std::allocator<Population>,Population&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 0x28),
                       (Population **)(local_1b8 + 0x20),(allocator<Population> *)(local_1b8 + 0x1f)
                       ,(Population *)uVar19);
            uVar4 = local_1b8._32_8_;
            iVar7 = Population::GetAnimalAmount((Population *)local_1b8._32_8_);
            Population::SetAnimalAmount((Population *)uVar4,iVar7 / 2);
            iVar7 = Population::GetAnimalAmount((Population *)uVar19);
            Population::SetAnimalAmount((Population *)uVar19,iVar7 / 2);
            p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
            uVar4 = local_1b8._8_8_;
            p_Var14->_M_use_count = 1;
            p_Var14->_M_weak_count = 1;
            p_Var14->_vptr__Sp_counted_base = local_168;
            local_1b8._0_8_ = p_Var14 + 1;
            p_Var14[1]._M_use_count = 0;
            p_Var14[1]._M_weak_count = 0;
            p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var14[2]._M_use_count = 0;
            p_Var14[2]._M_weak_count = 0;
            p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var14[1]._vptr__Sp_counted_base = local_170;
            p_Var14[3]._M_use_count = -1;
            p_Var14[3]._M_weak_count = -1;
            bVar22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pp_Var15 = local_170;
            local_1b8._8_8_ = p_Var14;
            if (bVar22) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
              pp_Var15 = (((CompoundMutation *)local_1b8._0_8_)->super_MutationComponent).
                         _vptr_MutationComponent;
            }
            uVar18 = (int)local_190._8_8_ + pVar13.first;
            uVar21 = iVar6 + pVar13.second;
            (**pp_Var15)(local_1b8._0_8_,(ulong)uVar18,(ulong)uVar21);
            local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1b8._32_8_;
            local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
              }
            }
            Handler::setPopulation((Handler *)local_1b8._0_8_,&local_118);
            if (local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            this_00 = (Player *)*local_160;
            local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1b8._32_8_;
            local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
              }
            }
            Player::addNewPopulation(this_00,&local_128);
            if (local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            sVar11 = (size_t)(int)uVar21;
            pvVar16 = Map::operator[]((Map *)((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)
                                             local_1b8._16_8_)->_M_ptr,sVar11);
            pCVar1 = (pvVar16->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1b8._32_8_;
            local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._M_allocated_capacity + 8) =
                     *(_Atomic_word *)(local_190._M_allocated_capacity + 8) + 1;
              }
            }
            CellType::setCurrentPopulation(pCVar1,&local_138);
            if (local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            TVar9 = Population::GetType((Population *)uVar19);
            peVar2 = ((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)local_1b8._16_8_)->_M_ptr;
            if (TVar9 == HERBIVORE) {
              pvVar16 = Map::operator[]((Map *)peVar2,sVar11);
              CellType::setHerbivoreCount
                        ((pvVar16->
                         super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                         super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
              uVar19 = local_190._M_allocated_capacity;
            }
            else {
              pvVar16 = Map::operator[]((Map *)peVar2,sVar11);
              CellType::setCarnivoreCount
                        ((pvVar16->
                         super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                         super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
              uVar19 = local_190._M_allocated_capacity;
            }
          }
          goto LAB_00128754;
        }
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
        uVar4 = local_1b8._8_8_;
        p_Var14->_M_use_count = 1;
        p_Var14->_M_weak_count = 1;
        p_Var14->_vptr__Sp_counted_base = local_168;
        local_1b8._0_8_ = p_Var14 + 1;
        p_Var14[1]._M_use_count = 0;
        p_Var14[1]._M_weak_count = 0;
        p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var14[2]._M_use_count = 0;
        p_Var14[2]._M_weak_count = 0;
        p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var14[1]._vptr__Sp_counted_base = local_170;
        p_Var14[3]._M_use_count = -1;
        p_Var14[3]._M_weak_count = -1;
        bVar22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8._8_8_ = p_Var14;
        if (bVar22) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar19;
        local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
          }
        }
        pVar13 = getDestinationPos((GameEngine *)local_1b8._16_8_,&local_c8);
        if (local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        uVar18 = pVar13.first + (int)local_190._8_8_;
        uVar21 = pVar13.second + iVar6;
        (**(((CompoundMutation *)local_1b8._0_8_)->super_MutationComponent)._vptr_MutationComponent)
                  (local_1b8._0_8_,(ulong)uVar18,(ulong)uVar21);
        local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar19;
        local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
          }
        }
        Handler::setPopulation((Handler *)local_1b8._0_8_,&local_d8);
        if (local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        sVar11 = (size_t)iVar6;
        pvVar16 = Map::operator[]((Map *)((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)
                                         local_1b8._16_8_)->_M_ptr,sVar11);
        lVar20 = (long)(int)local_190._8_4_;
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CellType::setCurrentPopulation
                  ((pvVar16->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar20].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88);
        if (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        index = (size_t)(int)uVar21;
        pvVar16 = Map::operator[]((Map *)((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)
                                         local_1b8._16_8_)->_M_ptr,index);
        pCVar1 = (pvVar16->
                 super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                 super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar19;
        local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
          }
        }
        CellType::setCurrentPopulation(pCVar1,&local_e8);
        if (local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        TVar9 = Population::GetType((Population *)uVar19);
        peVar2 = ((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)local_1b8._16_8_)->_M_ptr;
        if (TVar9 == HERBIVORE) {
          pvVar16 = Map::operator[]((Map *)peVar2,sVar11);
          CellType::setHerbivoreCount
                    ((pvVar16->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar20].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
          pvVar16 = Map::operator[]((Map *)((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)
                                           local_1b8._16_8_)->_M_ptr,index);
          CellType::setHerbivoreCount
                    ((pvVar16->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
        }
        else {
          pvVar16 = Map::operator[]((Map *)peVar2,sVar11);
          CellType::setCarnivoreCount
                    ((pvVar16->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar20].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
          pvVar16 = Map::operator[]((Map *)((__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> *)
                                           local_1b8._16_8_)->_M_ptr,index);
          CellType::setCarnivoreCount
                    ((pvVar16->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
        }
      }
LAB_0012875e:
      std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::push_back
                (&local_a8,(value_type *)local_1b8);
      if (local_150 != 0) {
        this_01 = *(Handler **)
                   ((long)&local_a8.
                           super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   local_158);
        local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)&((local_a8.
                        super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + local_158);
        local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((local_a8.
                        super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi +
              local_158);
        if (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Handler::setNext(this_01,&local_148);
        if (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      uVar17 = local_150 + 1;
      local_158 = local_158 + 0x10;
    } while (local_38 != uVar17);
  }
  pGVar5 = local_40;
  (local_40->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((local_a8.
         super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var14 = ((local_a8.
              super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (local_40->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var14;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::~vector
            (&local_a8);
  sVar23.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar23.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pGVar5;
  return (shared_ptr<Handler>)sVar23.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Handler> GameEngine::generateBotHandlersChain(std::shared_ptr<Player> bot) {
  std::vector<std::shared_ptr<Handler> > chain;
  int32_t populationAmount = bot->getPopulationsNumber();
  for (int32_t i = 0; i < populationAmount; ++i) {
    std::shared_ptr<Population> tempPopulation = std::move(bot->getPopulation(i));
    std::shared_ptr<Handler> link;
    int32_t x = tempPopulation->GetXPos();
    int32_t y = tempPopulation->GetYPos();
    int32_t dX, dY;
    std::pair<int32_t, int32_t> pos;
    int32_t mutationType;
    int32_t handlerType = RandomGenerator::getInstance().randInt(1, 2);
    if (tempPopulation->GetAnimalAmount() * 10
        > Config::getInstance().getMaxAmount(tempPopulation->GetType(), tempPopulation->GetSize()) * 9) {
    handlerType = 3;
    }
    switch (handlerType) {
      case 1:mutationType = RandomGenerator::getInstance().randInt(0, 3);
        switch (mutationType) {
          case 0:link = std::make_shared<CoverMutationHandler>();
            break;
          case 1:link = std::make_shared<SafetyMutationHandler>();
            break;
          case 2:link = std::make_shared<SizeMutationHandler>();
            break;
          case 3:link = std::make_shared<VelocityMutationHandler>();
            break;
        }
        link->setPopulation(tempPopulation);
        break;
      case 2:link = std::make_shared<MoveHandler>();
        pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        link->setXYPos(x + dX, y + dY);
        link->setPopulation(tempPopulation);
        (*map)[y][x]->setCurrentPopulation(nullptr);
        (*map)[y + dY][x + dX]->setCurrentPopulation(tempPopulation);
        if (tempPopulation->GetType() == Population::HERBIVORE) {
          (*map)[y][x]->setHerbivoreCount(0);
          (*map)[y + dY][x + dX]->setHerbivoreCount(1);
        } else {
          (*map)[y][x]->setCarnivoreCount(0);
          (*map)[y + dY][x + dX]->setCarnivoreCount(1);
        }
        break;
      case 3:pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        if (dX == 0 && dY == 0) {
          link = std::make_shared<VelocityMutationHandler>();
          link->setPopulation(tempPopulation);
        } else {
          std::shared_ptr<Population> newPopulation = std::make_shared<Population>(*(tempPopulation));
          newPopulation->SetAnimalAmount(newPopulation->GetAnimalAmount() / 2);
          tempPopulation->SetAnimalAmount(tempPopulation->GetAnimalAmount() / 2);
          link = std::make_shared<MoveHandler>();
          link->setXYPos(x + dX, y + dY);
          link->setPopulation(newPopulation);
          bot->addNewPopulation(newPopulation);
          (*map)[y + dY][x + dX]->setCurrentPopulation(newPopulation);
          if (tempPopulation->GetType() == Population::HERBIVORE) {
            (*map)[y + dY][x + dX]->setHerbivoreCount(1);
          } else {
            (*map)[y + dY][x + dX]->setCarnivoreCount(1);
          }
        }
        break;
    }
    chain.push_back(link);
    if (i > 0) {
      chain[i - 1]->setNext(chain[i]);
    }
  }
  return chain[0];
}